

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void sorter_grail_merge_right(int64_t *arr,int L1,int L2,int M)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int p1;
  int p2;
  int p0;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  
  local_18 = in_ESI + in_EDX + in_ECX;
  local_20 = in_ESI + -1;
  local_1c = in_ESI + in_EDX + -1;
  while (local_18 = local_18 + -1, -1 < local_20) {
    if ((local_1c < in_ESI) ||
       (0 < *(long *)(in_RDI + (long)local_20 * 8) - *(long *)(in_RDI + (long)local_1c * 8))) {
      sorter_grail_swap1((int64_t *)(in_RDI + (long)local_18 * 8),
                         (int64_t *)(in_RDI + (long)local_20 * 8));
      local_20 = local_20 + -1;
    }
    else {
      sorter_grail_swap1((int64_t *)(in_RDI + (long)local_18 * 8),
                         (int64_t *)(in_RDI + (long)local_1c * 8));
      local_1c = local_1c + -1;
    }
  }
  if (local_1c != local_18) {
    while (in_ESI <= local_1c) {
      sorter_grail_swap1((int64_t *)(in_RDI + (long)local_18 * 8),
                         (int64_t *)(in_RDI + (long)local_1c * 8));
      local_1c = local_1c + -1;
      local_18 = local_18 + -1;
    }
  }
  return;
}

Assistant:

static void GRAIL_MERGE_RIGHT(SORT_TYPE *arr, int L1, int L2, int M) {
  int p0 = L1 + L2 + M - 1, p2 = L1 + L2 - 1, p1 = L1 - 1;

  while (p1 >= 0) {
    if (p2 < L1 || SORT_CMP_A(arr + p1, arr + p2) > 0) {
      GRAIL_SWAP1(arr + (p0--), arr + (p1--));
    } else {
      GRAIL_SWAP1(arr + (p0--), arr + (p2--));
    }
  }

  if (p2 != p0)
    while (p2 >= L1) {
      GRAIL_SWAP1(arr + (p0--), arr + (p2--));
    }
}